

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  SourceLineInfo *_lineInfo;
  size_t *psVar1;
  TestCase *_name;
  IStreamingReporter *pIVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool _missingAssertions;
  uint uVar8;
  SectionInfo testCaseSection;
  StreamRedirect cerrRedir;
  SectionStats testCaseSectionStats;
  string local_508;
  size_t local_4e8;
  size_t sStack_4e0;
  SectionInfo local_4d0;
  undefined1 local_468 [408];
  undefined1 local_2d0 [32];
  string local_2b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  undefined8 local_290;
  _Alloc_hider local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  Flags local_268;
  
  _name = this->m_activeTestCase;
  _lineInfo = &(_name->super_TestCaseInfo).lineInfo;
  SectionInfo::SectionInfo
            (&local_4d0,_lineInfo,(string *)_name,&(_name->super_TestCaseInfo).description);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar2,&local_4d0);
  local_4e8 = (this->m_totals).assertions.passed;
  sStack_4e0 = (this->m_totals).assertions.failed;
  sVar3 = (this->m_totals).assertions.failedButOk;
  local_468._0_8_ = local_468 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"TEST_CASE","");
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"");
  AssertionInfo::AssertionInfo
            ((AssertionInfo *)local_2d0,(string *)local_468,_lineInfo,&local_508,Normal);
  std::__cxx11::string::operator=((string *)&this->m_lastAssertionInfo,(string *)local_2d0);
  std::__cxx11::string::operator=((string *)&(this->m_lastAssertionInfo).lineInfo,local_2b0);
  (this->m_lastAssertionInfo).lineInfo.line = local_290;
  std::__cxx11::string::operator=
            ((string *)&(this->m_lastAssertionInfo).capturedExpression,(string *)&local_288);
  (this->m_lastAssertionInfo).resultDisposition = local_268;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_p != &local_278) {
    operator_delete(local_288._M_p,local_278._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._0_8_ != &local_2a0) {
    operator_delete((void *)local_2b0._0_8_,local_2a0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_2d0._4_4_,local_2d0._0_4_) != local_2d0 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_2d0._4_4_,local_2d0._0_4_),local_2d0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
    operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
  }
  seedRng((this->m_config).m_p);
  gettimeofday((timeval *)local_2d0,(__timezone_ptr_t)0x0);
  uVar7 = local_2d0._8_4_;
  uVar6 = local_2d0._0_4_;
  uVar8 = (*(((this->m_reporter).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  if ((uVar8 & 1) == 0) {
    invokeActiveTestCase(this);
  }
  else {
    StreamRedirect::StreamRedirect((StreamRedirect *)local_2d0,(ostream *)&std::cout,redirectedCout)
    ;
    StreamRedirect::StreamRedirect((StreamRedirect *)local_468,(ostream *)&std::cerr,redirectedCerr)
    ;
    invokeActiveTestCase(this);
    StreamRedirect::~StreamRedirect((StreamRedirect *)local_468);
    StreamRedirect::~StreamRedirect((StreamRedirect *)local_2d0);
  }
  gettimeofday((timeval *)local_2d0,(__timezone_ptr_t)0x0);
  (*(this->m_testCaseTracker->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
    _vptr_NonCopyable[10])();
  handleUnfinishedSections(this);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::_M_erase_at_end
            (&this->m_messages,
             (this->m_messages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start);
  local_468._0_8_ = (this->m_totals).assertions.passed - local_4e8;
  local_468._8_8_ = (this->m_totals).assertions.failed - sStack_4e0;
  local_468._16_8_ = (this->m_totals).assertions.failedButOk - sVar3;
  _missingAssertions = testForMissingAssertions(this,(Counts *)local_468);
  uVar5 = local_468._16_8_;
  uVar4 = local_468._8_8_;
  if (((_name->super_TestCaseInfo).properties & (MayFail|ShouldFail)) != None) {
    local_468._16_8_ = local_468._8_8_;
    local_468._8_8_ = uVar5;
    psVar1 = &(this->m_totals).assertions.failed;
    *psVar1 = *psVar1 - uVar4;
    psVar1 = &(this->m_totals).assertions.failedButOk;
    *psVar1 = (size_t)(uVar4 + *psVar1);
  }
  SectionStats::SectionStats
            ((SectionStats *)local_2d0,&local_4d0,(Counts *)local_468,
             (double)(uint)((local_2d0._8_4_ - uVar7) + (local_2d0._0_4_ - uVar6) * 1000000) * 1e-06
             ,_missingAssertions);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar2,local_2d0);
  SectionStats::~SectionStats((SectionStats *)local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0.lineInfo.file._M_dataplus._M_p != &local_4d0.lineInfo.file.field_2) {
    operator_delete(local_4d0.lineInfo.file._M_dataplus._M_p,
                    local_4d0.lineInfo.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0.description._M_dataplus._M_p != &local_4d0.description.field_2) {
    operator_delete(local_4d0.description._M_dataplus._M_p,
                    local_4d0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0.name._M_dataplus._M_p != &local_4d0.name.field_2) {
    operator_delete(local_4d0.name._M_dataplus._M_p,local_4d0.name.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void runCurrentTest( std::string& redirectedCout, std::string& redirectedCerr ) {
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description );
            m_reporter->sectionStarting( testCaseSection );
            Counts prevAssertions = m_totals.assertions;
            double duration = 0;
            try {
                m_lastAssertionInfo = AssertionInfo( "TEST_CASE", testCaseInfo.lineInfo, "", ResultDisposition::Normal );

                seedRng( *m_config );

                Timer timer;
                timer.start();
                if( m_reporter->getPreferences().shouldRedirectStdOut ) {
                    StreamRedirect coutRedir( Catch::cout(), redirectedCout );
                    StreamRedirect cerrRedir( Catch::cerr(), redirectedCerr );
                    invokeActiveTestCase();
                }
                else {
                    invokeActiveTestCase();
                }
                duration = timer.getElapsedSeconds();
            }
            catch( TestFailureException& ) {
                // This just means the test was aborted due to failure
            }
            catch(...) {
                makeUnexpectedResultBuilder().useActiveException();
            }
            m_testCaseTracker->close();
            handleUnfinishedSections();
            m_messages.clear();

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            if( testCaseInfo.okToFail() ) {
                std::swap( assertions.failedButOk, assertions.failed );
                m_totals.assertions.failed -= assertions.failedButOk;
                m_totals.assertions.failedButOk += assertions.failedButOk;
            }

            SectionStats testCaseSectionStats( testCaseSection, assertions, duration, missingAssertions );
            m_reporter->sectionEnded( testCaseSectionStats );
        }